

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O2

void Nf_ManPreparePrint(int nVars,int *pComp,int *pPerm,char (*Line) [8])

{
  char cVar1;
  uint uVar2;
  int iVar3;
  byte bVar4;
  ulong uVar5;
  uint uVar6;
  int *piVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  char (*pacVar14) [8];
  long lVar15;
  int local_70;
  
  uVar2 = Extra_Factorial(nVars);
  uVar9 = 0;
  uVar5 = 0;
  if (0 < nVars) {
    uVar5 = (ulong)(uint)nVars;
  }
  uVar6 = nVars + 0x40;
  for (; uVar5 != uVar9; uVar9 = uVar9 + 1) {
    (*Line)[uVar9] = (char)uVar6;
    uVar6 = (uint)(byte)((char)uVar6 - 1);
  }
  bVar4 = (byte)nVars & 0x1f;
  uVar6 = 1 << bVar4;
  if (1 << bVar4 < 1) {
    uVar6 = 0;
  }
  uVar5 = 0;
  if (0 < (int)uVar2) {
    uVar5 = (ulong)uVar2;
  }
  (*Line + nVars)[0] = '+';
  (*Line + nVars)[1] = '\0';
  iVar3 = 0;
  iVar8 = 0;
  do {
    if (iVar3 == 2) {
      if (iVar8 == uVar2 * 2 << ((byte)nVars & 0x1f)) {
        iVar3 = 0;
        for (uVar2 = 0; uVar2 != 2; uVar2 = uVar2 + 1) {
          for (uVar9 = 0; local_70 = (int)uVar5, (int)uVar9 != local_70;
              uVar9 = (ulong)((int)uVar9 + 1)) {
            pacVar14 = Line + iVar3;
            uVar13 = 0;
            while (uVar10 = (uint)uVar13, uVar6 != uVar10) {
              printf("%8d : %d %3d %2d : %s\n",(ulong)(iVar3 + uVar10),(ulong)uVar2,uVar9,uVar13,
                     pacVar14);
              pacVar14 = pacVar14 + 1;
              uVar13 = (ulong)(uVar10 + 1);
            }
            iVar3 = iVar3 + uVar10;
          }
        }
        return;
      }
      __assert_fail("n == 2*nPerms*nMints",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/mio/mioUtils.c"
                    ,0x511,"void Nf_ManPreparePrint(int, int *, int *, char (*)[8])");
    }
    Line[iVar8][nVars] = (iVar3 != 0) * '\x02' + '+';
    for (uVar9 = 0; uVar9 != uVar5; uVar9 = uVar9 + 1) {
      lVar11 = (long)iVar8;
      lVar12 = lVar11 << 0x20;
      piVar7 = pComp;
      for (lVar15 = 0; (ulong)uVar6 * 8 - lVar15 != 0; lVar15 = lVar15 + 8) {
        strcpy(Line[lVar11 + 1] + lVar15,Line[lVar11] + lVar15);
        bVar4 = Line[lVar11 + 1][*piVar7 + lVar15];
        if ((byte)(bVar4 + 0xbf) < 0x1a) {
          bVar4 = bVar4 | 0x20;
LAB_0034f71b:
          Line[lVar11 + 1][lVar15 + *piVar7] = bVar4;
        }
        else if ((byte)(bVar4 + 0x9f) < 0x1a) {
          bVar4 = bVar4 - 0x20;
          goto LAB_0034f71b;
        }
        lVar12 = lVar12 + 0x100000000;
        iVar8 = iVar8 + 1;
        piVar7 = piVar7 + 1;
      }
      lVar11 = (long)pPerm[uVar9];
      lVar12 = lVar12 >> 0x1d;
      cVar1 = (*Line)[lVar11 + lVar12];
      (*Line)[lVar11 + lVar12] = (*Line)[lVar11 + 1 + lVar12];
      (*Line)[lVar11 + 1 + lVar12] = cVar1;
    }
    iVar3 = iVar3 + 1;
  } while( true );
}

Assistant:

void Nf_ManPreparePrint( int nVars, int * pComp, int * pPerm, char Line[2*720*64][8] )
{
    int nPerms = Extra_Factorial( nVars );
    int nMints = (1 << nVars);
    char * pChar, * pChar2;
    int i, p, c, n = 0;
    for ( i = 0; i < nVars; i++ )
        Line[0][i] = 'A' + nVars - 1 - i;
    Line[0][nVars] = '+';
    Line[0][nVars+1] = 0;
    for ( i = 0; i < 2; i++ )
    {
        Line[n][nVars] = i ? '-' : '+';
        for ( p = 0; p < nPerms; p++ )
        {
            for ( c = 0; c < nMints; c++ )
            {
                strcpy( Line[n+1], Line[n] ); n++;
                pChar = &Line[n][pComp[c]];
                if ( *pChar >= 'A' && *pChar <= 'Z' )
                    *pChar += 'a' - 'A';
                else if ( *pChar >= 'a' && *pChar <= 'z' )
                    *pChar -= 'a' - 'A';
            }
            pChar  = &Line[n][pPerm[p]];
            pChar2 = pChar + 1;
            ABC_SWAP( char, *pChar, *pChar2 );
        }
    }
    assert( n == 2*nPerms*nMints );
    n = 0;
    for ( i = 0; i < 2; i++ )
        for ( p = 0; p < nPerms; p++ )
            for ( c = 0; c < nMints; c++ )
                printf("%8d : %d %3d %2d : %s\n", n, i, p, c, Line[n]), n++;
}